

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::AppendVersionInfo(RowGroup *this,TransactionData transaction,idx_t count)

{
  ulong uVar1;
  idx_t row_group_start;
  RowVersionManager *this_00;
  ulong row_group_end;
  
  uVar1 = ((this->collection)._M_data)->row_group_size;
  row_group_start =
       (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  row_group_end = count + row_group_start;
  if (uVar1 <= row_group_end) {
    row_group_end = uVar1;
  }
  this_00 = GetOrCreateVersionInfo(this);
  RowVersionManager::AppendVersionInfo(this_00,transaction,count,row_group_start,row_group_end);
  LOCK();
  (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i =
       row_group_end;
  UNLOCK();
  return;
}

Assistant:

void RowGroup::AppendVersionInfo(TransactionData transaction, idx_t count) {
	const idx_t row_group_size = GetRowGroupSize();
	idx_t row_group_start = this->count.load();
	idx_t row_group_end = row_group_start + count;
	if (row_group_end > row_group_size) {
		row_group_end = row_group_size;
	}
	// create the version_info if it doesn't exist yet
	auto &vinfo = GetOrCreateVersionInfo();
	vinfo.AppendVersionInfo(transaction, count, row_group_start, row_group_end);
	this->count = row_group_end;
}